

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assignment.cpp
# Opt level: O2

double sq_err(array<double,_5UL> *a1,array<double,_5UL> *a2)

{
  size_t i;
  long lVar1;
  double se;
  double dVar2;
  
  se = 0.0;
  for (lVar1 = 0; lVar1 != 5; lVar1 = lVar1 + 1) {
    dVar2 = a1->_M_elems[lVar1] - a2->_M_elems[lVar1];
    se = se + dVar2 * dVar2;
  }
  return se;
}

Assistant:

double sq_err(const std::array<double, test_len>& a1,
              const std::array<double, test_len>& a2) {
    double se {0};
    
    for (size_t i {0} ; i < test_len ; i++) {
        double e { a1[i] - a2[i] };
        se += e*e;
    }
    
    return se;
}